

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fImplementationLimitTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange>::iterate
          (LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  float extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  char *description;
  MessageBuilder local_4b8;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  byte local_21;
  FloatRange FStack_20;
  bool isOk;
  FloatRange value;
  Functions *gl;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *this_local;
  
  pRVar2 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  value.min = (float)(*pRVar2->_vptr_RenderContext[3])();
  value.max = extraout_var;
  pRVar2 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  FStack_20 = LimitQuery::query<deqp::gles2::Functional::LimitQuery::FloatRange>
                        ((Functions *)CONCAT44(extraout_var_00,iVar1),this->m_limit);
  err = (**(code **)((long)value + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fImplementationLimitTests.cpp"
                  ,0xa0);
  local_21 = LimitQuery::compare<deqp::gles2::Functional::LimitQuery::FloatRange>
                       (&this->m_minRequiredValue,&stack0xffffffffffffffe0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [11])"Reported: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xffffffffffffffe0);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_338,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [19])"Minimum required: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_minRequiredValue);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  if ((local_21 & 1) == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4b8,
                        (char (*) [58])"FAIL: reported value is less than minimum required value!");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
  }
  description = "Requirement not satisfied";
  if ((local_21 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((local_21 & 1) == 0),description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const T					value	= query<T>(m_context.getRenderContext().getFunctions(), m_limit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		const bool isOk = compare<T>(m_minRequiredValue, value);

		m_testCtx.getLog() << TestLog::Message << "Reported: " << value << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << "Minimum required: " << m_minRequiredValue << TestLog::EndMessage;

		if (!isOk)
			m_testCtx.getLog() << TestLog::Message << "FAIL: reported value is less than minimum required value!" << TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}